

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTPSTRDec(char *val,size_t *len,octet *der,size_t count,u32 tag)

{
  byte bVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  size_t count_00;
  ulong uVar5;
  u32 t;
  size_t l;
  u32 local_44;
  size_t *local_40;
  size_t local_38;
  
  local_40 = len;
  sVar2 = derTLDec(&local_44,&local_38,der,count);
  count_00 = local_38;
  if (((sVar2 == 0xffffffffffffffff) || (uVar5 = sVar2 + local_38, count < uVar5)) ||
     (local_44 != tag || uVar5 == 0xffffffffffffffff)) {
LAB_0011210f:
    uVar5 = 0xffffffffffffffff;
  }
  else {
    if (local_38 != 0) {
      sVar4 = 0;
      do {
        bVar1 = (der + sVar2)[sVar4];
        if ((((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) &&
           (pvVar3 = memchr(" \'()+,-./:=?",(int)(char)bVar1,0xd), pvVar3 == (void *)0x0))
        goto LAB_0011210f;
        sVar4 = sVar4 + 1;
      } while (count_00 != sVar4);
    }
    if (val != (char *)0x0) {
      memMove(val,der + sVar2,count_00);
      val[local_38] = '\0';
      count_00 = local_38;
    }
    if (local_40 != (size_t *)0x0) {
      *local_40 = count_00;
    }
  }
  return uVar5;
}

Assistant:

size_t derTPSTRDec(char* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	size_t pos;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// проверить символы (см. strIsPrintable())
	for (pos = 0; pos < l; ++pos)
	{
		register char ch = (char)v[pos];
		if ((ch < '0' || ch > '9') &&
			(ch < 'A' || ch > 'Z') &&
			(ch < 'a' || ch > 'z') &&
			strchr(" '()+,-./:=?", ch) == 0)
		{
			ch = 0;
			return SIZE_MAX;
		}
		ch = 0;
	}
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l + 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l + 1));
		memMove(val, v, l);
		val[l] = 0;
	}
	// возвратить длину строки
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}